

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O0

void __thiscall
Catch::ReporterRegistrar<Catch::ConsoleReporter>::ReporterRegistrar
          (ReporterRegistrar<Catch::ConsoleReporter> *this,string *name)

{
  string *psVar1;
  IMutableRegistryHub *pIVar2;
  shared_ptr<Catch::ReporterRegistrar<Catch::ConsoleReporter>::ReporterFactory> local_38;
  shared_ptr<Catch::IReporterFactory> local_28;
  string *local_18;
  string *name_local;
  ReporterRegistrar<Catch::ConsoleReporter> *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  pIVar2 = getMutableRegistryHub();
  psVar1 = local_18;
  clara::std::make_shared<Catch::ReporterRegistrar<Catch::ConsoleReporter>::ReporterFactory>();
  std::shared_ptr<Catch::IReporterFactory>::
  shared_ptr<Catch::ReporterRegistrar<Catch::ConsoleReporter>::ReporterFactory,void>
            (&local_28,&local_38);
  (*pIVar2->_vptr_IMutableRegistryHub[2])(pIVar2,psVar1,&local_28);
  clara::std::shared_ptr<Catch::IReporterFactory>::~shared_ptr(&local_28);
  clara::std::shared_ptr<Catch::ReporterRegistrar<Catch::ConsoleReporter>::ReporterFactory>::
  ~shared_ptr(&local_38);
  return;
}

Assistant:

explicit ReporterRegistrar( std::string const& name ) {
            getMutableRegistryHub().registerReporter( name, std::make_shared<ReporterFactory>() );
        }